

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetFrameworkMultiConfigPostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string configProp;
  string local_78;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  pointer local_20;
  
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_58,config);
    local_38._M_len = 0x1f;
    local_38._M_str = "FRAMEWORK_MULTI_CONFIG_POSTFIX_";
    local_28 = local_58._M_string_length;
    local_20 = local_58._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = &local_38;
    cmCatViews_abi_cxx11_(&local_78,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cVar4 = GetProperty(this,&local_78);
    bVar2 = cmTarget::IsImported(this->Target);
    if (!bVar2) {
      if (cVar4.Value == (string *)0x0) {
        cVar4.Value = (string *)0x0;
      }
      else {
        bVar2 = IsFrameworkOnApple(this);
        if (bVar2) {
          iVar3 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
          if ((char)iVar3 == '\0') {
            cVar4.Value = (string *)0x0;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = ((cVar4.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (cVar4.Value)->_M_string_length);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkMultiConfigPostfix(
  const std::string& config) const
{
  cmValue postfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                      cmSystemTools::UpperCase(config));
    postfix = this->GetProperty(configProp);

    if (!this->IsImported() && postfix &&
        (this->IsFrameworkOnApple() &&
         !this->GetGlobalGenerator()->IsMultiConfig())) {
      postfix = nullptr;
    }
  }
  return postfix ? *postfix : std::string();
}